

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex_posix.c
# Opt level: O0

int mutex_lock_shared(mutex_handle *mutex)

{
  void *pvVar1;
  int iVar2;
  int ret;
  mutex_priv *priv;
  mutex_handle *mutex_local;
  
  pvVar1 = mutex->priv;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)((long)pvVar1 + 0x30));
  if (iVar2 == 0) {
    *(int *)((long)pvVar1 + 0x58) = *(int *)((long)pvVar1 + 0x58) + 1;
    iVar2 = pthread_mutex_unlock((pthread_mutex_t *)((long)pvVar1 + 0x30));
  }
  mutex_local._4_4_ = -iVar2;
  return mutex_local._4_4_;
}

Assistant:

int mutex_lock_shared(struct mutex_handle *mutex)
{
	struct mutex_priv *priv = mutex->priv;
	int ret;

	ret = pthread_mutex_lock(&priv->lock);
	if (ret != 0)
		return -ret;

	priv->readers++;

	return -pthread_mutex_unlock(&priv->lock);
}